

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderAllowSingleQuotesTestissue182::runTestCase
          (TestCharReaderAllowSingleQuotesTestissue182 *this)

{
  byte bVar1;
  uint uVar2;
  Value *pVVar3;
  CharReader *pCVar4;
  Value *expected;
  CharReaderBuilder *this_00;
  Value *in_RDI;
  bool ok_1;
  char doc_1 [20];
  bool ok;
  char doc [20];
  CharReader *reader;
  string errs;
  Value root;
  CharReaderBuilder b;
  Value *in_stack_fffffffffffffc88;
  Value *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  char *key;
  CharReaderBuilder *in_stack_fffffffffffffca0;
  Value *in_stack_fffffffffffffca8;
  TestResult *in_stack_fffffffffffffcb0;
  TestResult *result;
  Value *in_stack_fffffffffffffcb8;
  allocator *paVar5;
  CharReaderBuilder *in_stack_fffffffffffffcc0;
  Value *this_01;
  undefined7 in_stack_fffffffffffffd18;
  uint line;
  string local_2c8 [7];
  undefined1 in_stack_fffffffffffffd3f;
  TestResult *in_stack_fffffffffffffd40;
  undefined1 local_2a1 [33];
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  byte local_1e9;
  char local_1e8 [144];
  Value *in_stack_fffffffffffffea8;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  byte local_d9;
  char local_d8 [24];
  CharReader *local_c0;
  string local_b8 [32];
  undefined1 local_98 [152];
  
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffffca0);
  Json::Value::Value(in_stack_fffffffffffffc90,SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
  pVVar3 = Json::Value::operator[]((Value *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Json::Value::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Json::Value::~Value((Value *)in_stack_fffffffffffffcc0);
  Json::Value::Value((Value *)in_stack_fffffffffffffca0,
                     (ValueType)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  std::__cxx11::string::string(local_b8);
  pCVar4 = Json::CharReaderBuilder::newCharReader(in_stack_fffffffffffffcc0);
  builtin_strncpy(local_d8,"{\'a\':true,\"b\":true}",0x14);
  local_c0 = pCVar4;
  uVar2 = (*pCVar4->_vptr_CharReader[2])(pCVar4,local_d8,local_d8 + 0x13,local_98,local_b8);
  line = (uint)((ulong)pCVar4 >> 0x20);
  bVar1 = (byte)uVar2;
  local_d9 = bVar1 & 1;
  if ((uVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
               (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),in_stack_fffffffffffffc98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::__cxx11::string::string(local_128,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8,
             (string *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (uint)((ulong)in_stack_fffffffffffffc90 >> 0x20),(char *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  Json::Value::size(in_stack_fffffffffffffca8);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffffcb0,(uint)((ulong)in_stack_fffffffffffffca8 >> 0x20),
             (uint)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
             (uint)((ulong)in_stack_fffffffffffffc98 >> 0x20),(char *)in_stack_fffffffffffffc90);
  Json::Value::Value(in_stack_fffffffffffffc90,SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
  Json::Value::get(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   in_stack_fffffffffffffca8);
  JsonTest::checkEqual<bool,Json::Value>
            (in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,in_RDI,(char *)pVVar3,line,
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffd18));
  Json::Value::~Value((Value *)in_stack_fffffffffffffcc0);
  Json::Value::~Value((Value *)in_stack_fffffffffffffcc0);
  Json::Value::Value(in_stack_fffffffffffffc90,SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
  Json::Value::get(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                   in_stack_fffffffffffffca8);
  JsonTest::checkEqual<bool,Json::Value>
            (in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,in_RDI,(char *)pVVar3,line,
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffd18));
  Json::Value::~Value((Value *)in_stack_fffffffffffffcc0);
  Json::Value::~Value((Value *)in_stack_fffffffffffffcc0);
  builtin_strncpy(local_1e8,"{\'a\': \'x\', \"b\":\'y\'}",0x14);
  uVar2 = (*local_c0->_vptr_CharReader[2])(local_c0,local_1e8,local_1e8 + 0x13,local_98,local_b8);
  local_1e9 = (byte)uVar2 & 1;
  if ((uVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
               (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),in_stack_fffffffffffffc98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"",&local_211);
  std::__cxx11::string::string(local_238,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8,
             (string *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (uint)((ulong)in_stack_fffffffffffffc90 >> 0x20),(char *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  this_01 = *(Value **)&in_RDI->field_0x8;
  Json::Value::size(in_stack_fffffffffffffca8);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffffcb0,(uint)((ulong)in_stack_fffffffffffffca8 >> 0x20),
             (uint)in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0,
             (uint)((ulong)in_stack_fffffffffffffc98 >> 0x20),(char *)in_stack_fffffffffffffc90);
  uVar2 = (uint)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  result = *(TestResult **)&in_RDI->field_0x8;
  paVar5 = &local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"x",paVar5);
  expected = Json::Value::operator[]((Value *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffea8);
  JsonTest::checkStringEqual
            (result,(string *)expected,(string *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98
             ,uVar2,(char *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  key = *(char **)&in_RDI->field_0x8;
  pVVar3 = (Value *)local_2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_2a1 + 1),"y",(allocator *)pVVar3);
  this_00 = (CharReaderBuilder *)Json::Value::operator[](pVVar3,key);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffea8);
  JsonTest::checkStringEqual
            (result,(string *)expected,(string *)pVVar3,key,(uint)((ulong)this_00 >> 0x20),
             (char *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string((string *)(local_2a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2a1);
  if (local_c0 != (CharReader *)0x0) {
    (*local_c0->_vptr_CharReader[1])();
  }
  std::__cxx11::string::~string(local_b8);
  Json::Value::~Value(this_01);
  Json::CharReaderBuilder::~CharReaderBuilder(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowSingleQuotesTest, issue182) {
  Json::CharReaderBuilder b;
  b.settings_["allowSingleQuotes"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{'a':true,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(true, root.get("a", false));
    JSONTEST_ASSERT_EQUAL(true, root.get("b", false));
  }
  {
    char const doc[] = "{'a': 'x', \"b\":'y'}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_STRING_EQUAL("x", root["a"].asString());
    JSONTEST_ASSERT_STRING_EQUAL("y", root["b"].asString());
  }
  delete reader;
}